

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall TPZMatrix<Fad<double>_>::Identity(TPZMatrix<Fad<double>_> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Fad<double> local_50;
  
  lVar2 = (this->super_TPZBaseMatrix).fCol;
  if (lVar2 != (this->super_TPZBaseMatrix).fRow) {
    Error("identity (TPZMatrix<>*) <TPZMatrix<>must be square>",(char *)0x0);
    lVar2 = (this->super_TPZBaseMatrix).fRow;
  }
  if (0 < lVar2) {
    lVar1 = (this->super_TPZBaseMatrix).fCol;
    lVar3 = 0;
    do {
      if (0 < lVar1) {
        lVar2 = 0;
        do {
          if (lVar3 == lVar2) {
            local_50.val_ = 1.0;
            local_50.dx_.num_elts = 0;
            local_50.dx_.ptr_to_data = (double *)0x0;
            local_50.defaultVal = 0.0;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar3,lVar3,&local_50);
          }
          else {
            local_50.val_ = 0.0;
            local_50.dx_.num_elts = 0;
            local_50.dx_.ptr_to_data = (double *)0x0;
            local_50.defaultVal = 0.0;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar3,lVar2,&local_50);
          }
          Fad<double>::~Fad(&local_50);
          lVar2 = lVar2 + 1;
          lVar1 = (this->super_TPZBaseMatrix).fCol;
        } while (lVar2 < lVar1);
        lVar2 = (this->super_TPZBaseMatrix).fRow;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < lVar2);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Identity() {
	
    if ( Cols() != Rows() ) {
        Error( "identity (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,1.):PutVal(row,col,0.);
        }
    }
}